

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O1

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.used = false;
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"##teamcity[testStdOut name=\'",0x1c);
    escape(&local_40,&(testCaseStats->testInfo).name);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' out=\'",7);
    escape(&local_60,&testCaseStats->stdOut);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"##teamcity[testStdErr name=\'",0x1c);
    escape(&local_40,&(testCaseStats->testInfo).name);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' out=\'",7);
    escape(&local_60,&testCaseStats->stdErr);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"##teamcity[testFinished name=\'",0x1e);
  escape(&local_40,&(testCaseStats->testInfo).name);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' duration=\'",0xc);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::ostream::flush();
  return;
}

Assistant:

void testCaseEnded( TestCaseStats const& testCaseStats ) override {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            if( !testCaseStats.stdOut.empty() )
                stream << "##teamcity[testStdOut name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdOut ) << "']\n";
            if( !testCaseStats.stdErr.empty() )
                stream << "##teamcity[testStdErr name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdErr ) << "']\n";
            stream << "##teamcity[testFinished name='"
                    << escape( testCaseStats.testInfo.name ) << "' duration='"
                    << m_testTimer.getElapsedMilliseconds() << "']\n";
            stream.flush();
        }